

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

int IsValidSimpleFormat(WebPDemuxer *dmux)

{
  Frame *pFVar1;
  Frame *frame;
  WebPDemuxer *dmux_local;
  int local_4;
  
  pFVar1 = dmux->frames;
  if (dmux->state == WEBP_DEMUX_PARSING_HEADER) {
    local_4 = 1;
  }
  else if ((dmux->canvas_width < 1) || (dmux->canvas_height < 1)) {
    local_4 = 0;
  }
  else if ((dmux->state == WEBP_DEMUX_DONE) && (pFVar1 == (Frame *)0x0)) {
    local_4 = 0;
  }
  else if ((pFVar1->width < 1) || (pFVar1->height < 1)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int IsValidSimpleFormat(const WebPDemuxer* const dmux) {
  const Frame* const frame = dmux->frames;
  if (dmux->state == WEBP_DEMUX_PARSING_HEADER) return 1;

  if (dmux->canvas_width <= 0 || dmux->canvas_height <= 0) return 0;
  if (dmux->state == WEBP_DEMUX_DONE && frame == NULL) return 0;

  if (frame->width <= 0 || frame->height <= 0) return 0;
  return 1;
}